

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

cio_websocket_write_job * write_jobs_popfront(cio_websocket *websocket)

{
  size_t *psVar1;
  cio_write_buffer *pcVar2;
  cio_write_buffer *pcVar3;
  cio_websocket_write_job *pcVar4;
  
  pcVar4 = dequeue_job(websocket);
  pcVar2 = pcVar4->wbh;
  pcVar3 = pcVar2->next;
  if (pcVar3 != (cio_write_buffer *)0x0 && pcVar3 != pcVar2) {
    (pcVar2->data).head.q_len = (pcVar2->data).head.q_len - 1;
    psVar1 = &(pcVar2->data).element.length;
    *psVar1 = *psVar1 - (pcVar3->data).element.length;
    pcVar2 = pcVar3->next;
    pcVar3 = pcVar3->prev;
    pcVar2->prev = pcVar3;
    pcVar3->next = pcVar2;
  }
  pcVar4->wbh = (cio_write_buffer *)0x0;
  return pcVar4;
}

Assistant:

static inline const struct cio_websocket_write_job *write_jobs_popfront(struct cio_websocket *websocket)
{
	struct cio_websocket_write_job *job = dequeue_job(websocket);
	remove_websocket_header(job);
	job->wbh = NULL;

	return job;
}